

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O0

void run_tests(int mode,char *description)

{
  MMDB_entry_data_list_s *pMVar1;
  MMDB_entry_data_s entry_data;
  MMDB_entry_data_list_s *entry_data_list_00;
  int iVar2;
  char *pcVar3;
  MMDB_s *mmdb_00;
  undefined8 in_stack_ffffffffffffff78;
  char *key_name;
  MMDB_entry_data_list_s *key;
  int status;
  MMDB_entry_data_list_s *first;
  MMDB_entry_data_list_s *entry_data_list;
  MMDB_lookup_result_s result;
  char *ip;
  MMDB_s *mmdb;
  char *path;
  char *filename;
  char *description_local;
  int mode_local;
  
  pcVar3 = test_database_path("MaxMind-DB-test-decoder.mmdb");
  mmdb_00 = open_ok(pcVar3,mode,description);
  free(pcVar3);
  result._24_8_ = anon_var_dwarf_36f;
  lookup_string_ok((MMDB_lookup_result_s *)&entry_data_list,mmdb_00,"1.1.1.1",
                   "MaxMind-DB-test-decoder.mmdb",description);
  iVar2 = MMDB_get_entry_data_list((MMDB_entry_s *)&result,&first);
  if (iVar2 == 0) {
    cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                  ,0x169,0,"==",0,"MMDB_get_entry_data_list succeeded",0);
  }
  else {
    pcVar3 = MMDB_strerror(iVar2);
    bail_out(0,"MMDB_get_entry_data_list failed with %s",pcVar3,0);
  }
  entry_data_list_00 = first;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x171,(first->entry_data).type,"==",7,"first entry in entry data list is a map",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x175,(first->entry_data).data_size,"==",0xc,
                "first map in entry data list has 12 k/v pairs",0);
  while (pMVar1 = first->next, first = pMVar1, pMVar1 != (MMDB_entry_data_list_s *)0x0) {
    cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                  ,0x181,(pMVar1->entry_data).type,"==",2,"found a map key",0);
    entry_data.data_size = (int)in_stack_ffffffffffffff78;
    entry_data.type = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    entry_data._0_40_ = *(undefined1 (*) [40])&(pMVar1->entry_data).field_0x8;
    pcVar3 = dup_entry_string_or_bail(entry_data);
    iVar2 = strcmp(pcVar3,"array");
    if (iVar2 == 0) {
      first = test_array_value(first);
    }
    else {
      iVar2 = strcmp(pcVar3,"boolean");
      if (iVar2 == 0) {
        first = test_boolean_value(first);
      }
      else {
        iVar2 = strcmp(pcVar3,"bytes");
        if (iVar2 == 0) {
          first = test_bytes_value(first);
        }
        else {
          iVar2 = strcmp(pcVar3,"double");
          if (iVar2 == 0) {
            first = test_double_value(first);
          }
          else {
            iVar2 = strcmp(pcVar3,"float");
            if (iVar2 == 0) {
              first = test_float_value(first);
            }
            else {
              iVar2 = strcmp(pcVar3,"int32");
              if (iVar2 == 0) {
                first = test_int32_value(first);
              }
              else {
                iVar2 = strcmp(pcVar3,"map");
                if (iVar2 == 0) {
                  first = test_map_value(first);
                }
                else {
                  iVar2 = strcmp(pcVar3,"uint128");
                  if (iVar2 == 0) {
                    first = test_uint128_value(first);
                  }
                  else {
                    iVar2 = strcmp(pcVar3,"uint16");
                    if (iVar2 == 0) {
                      first = test_uint16_value(first);
                    }
                    else {
                      iVar2 = strcmp(pcVar3,"uint32");
                      if (iVar2 == 0) {
                        first = test_uint32_value(first);
                      }
                      else {
                        iVar2 = strcmp(pcVar3,"uint64");
                        if (iVar2 == 0) {
                          first = test_uint64_value(first);
                        }
                        else {
                          iVar2 = strcmp(pcVar3,"utf8_string");
                          if (iVar2 == 0) {
                            first = test_utf8_string_value(first);
                          }
                          else {
                            ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                                      ,0x19d,0,"unknown key found in map - %s",pcVar3,0);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    free(pcVar3);
  }
  MMDB_free_entry_data_list(entry_data_list_00);
  MMDB_close(mmdb_00);
  free(mmdb_00);
  return;
}

Assistant:

void run_tests(int mode, const char *description) {
    const char *filename = "MaxMind-DB-test-decoder.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, description);
    free(path);

    char *ip = "1.1.1.1";
    MMDB_lookup_result_s result =
        lookup_string_ok(mmdb, ip, filename, description);

    MMDB_entry_data_list_s *entry_data_list, *first;
    int status = MMDB_get_entry_data_list(&result.entry, &entry_data_list);

    if (MMDB_SUCCESS != status) {
        BAIL_OUT("MMDB_get_entry_data_list failed with %s",
                 MMDB_strerror(status));
    } else {
        cmp_ok(
            status, "==", MMDB_SUCCESS, "MMDB_get_entry_data_list succeeded");
    }

    first = entry_data_list;

    cmp_ok(entry_data_list->entry_data.type,
           "==",
           MMDB_DATA_TYPE_MAP,
           "first entry in entry data list is a map");
    cmp_ok(entry_data_list->entry_data.data_size,
           "==",
           12,
           "first map in entry data list has 12 k/v pairs");

    while (1) {
        MMDB_entry_data_list_s *key = entry_data_list = entry_data_list->next;

        if (!key) {
            break;
        }

        cmp_ok(key->entry_data.type,
               "==",
               MMDB_DATA_TYPE_UTF8_STRING,
               "found a map key");

        char *key_name = dup_entry_string_or_bail(key->entry_data);
        if (strcmp(key_name, "array") == 0) {
            entry_data_list = test_array_value(entry_data_list);
        } else if (strcmp(key_name, "boolean") == 0) {
            entry_data_list = test_boolean_value(entry_data_list);
        } else if (strcmp(key_name, "bytes") == 0) {
            entry_data_list = test_bytes_value(entry_data_list);
        } else if (strcmp(key_name, "double") == 0) {
            entry_data_list = test_double_value(entry_data_list);
        } else if (strcmp(key_name, "float") == 0) {
            entry_data_list = test_float_value(entry_data_list);
        } else if (strcmp(key_name, "int32") == 0) {
            entry_data_list = test_int32_value(entry_data_list);
        } else if (strcmp(key_name, "map") == 0) {
            entry_data_list = test_map_value(entry_data_list);
        } else if (strcmp(key_name, "uint128") == 0) {
            entry_data_list = test_uint128_value(entry_data_list);
        } else if (strcmp(key_name, "uint16") == 0) {
            entry_data_list = test_uint16_value(entry_data_list);
        } else if (strcmp(key_name, "uint32") == 0) {
            entry_data_list = test_uint32_value(entry_data_list);
        } else if (strcmp(key_name, "uint64") == 0) {
            entry_data_list = test_uint64_value(entry_data_list);
        } else if (strcmp(key_name, "utf8_string") == 0) {
            entry_data_list = test_utf8_string_value(entry_data_list);
        } else {
            ok(0, "unknown key found in map - %s", key_name);
        }

        free(key_name);
    }

    MMDB_free_entry_data_list(first);

    MMDB_close(mmdb);
    free(mmdb);
}